

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QMdiAreaPrivate::activateWindow(QMdiAreaPrivate *this,QMdiSubWindow *child)

{
  Data *pDVar1;
  QMdiSubWindowPrivate *this_00;
  QObject *pQVar2;
  
  if ((this->childWindows).d.size != 0) {
    if (child == (QMdiSubWindow *)0x0) {
      pDVar1 = (this->active).wp.d;
      if ((pDVar1 != (Data *)0x0) &&
         (pQVar2 = (this->active).wp.value, pQVar2 != (QObject *)0x0 && *(int *)(pDVar1 + 4) != 0))
      {
        QMdiSubWindowPrivate::setActive(*(QMdiSubWindowPrivate **)(pQVar2 + 8),false,true);
        resetActiveWindow(this,(QMdiSubWindow *)0x0);
        return;
      }
    }
    else if ((((child->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
      pDVar1 = (this->active).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar2 = (QObject *)0x0;
      }
      else {
        pQVar2 = (this->active).wp.value;
      }
      if (pQVar2 != (QObject *)child) {
        this_00 = *(QMdiSubWindowPrivate **)&(child->super_QWidget).field_0x8;
        if ((this_00->isActive == true) &&
           (((pDVar1 == (Data *)0x0 || (*(int *)(pDVar1 + 4) == 0)) ||
            ((this->active).wp.value == (QObject *)0x0)))) {
          this_00->isActive = false;
        }
        QMdiSubWindowPrivate::setActive(this_00,true,true);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }